

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O3

void __thiscall
TPZMHMeshControl::DefinePartition(TPZMHMeshControl *this,TPZVec<long> *partitionindex)

{
  TPZGeoMesh *pTVar1;
  TPZGeoEl *pTVar2;
  long lVar3;
  TPZGeoEl *pTVar4;
  int iVar5;
  int iVar6;
  TPZGeoEl **ppTVar7;
  mapped_type *pmVar8;
  TPZGeoEl *pTVar9;
  int iVar10;
  long nelem;
  int iVar11;
  TPZGeoElSide gelside;
  TPZGeoElSide neighbour;
  TPZGeoElBC bc;
  TPZGeoElSide neighbour_1;
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  skeleton;
  TPZGeoElSide local_e8;
  pair<const_long,_std::pair<long,_long>_> local_d0;
  TPZVec<long> *local_b8;
  TPZMHMeshControl *local_b0;
  ulong local_a8;
  TPZGeoEl *local_a0;
  TPZGeoElBC local_98;
  undefined1 local_90 [8];
  TPZGeoEl *local_88;
  int local_80;
  TPZChunkVector<TPZGeoEl_*,_10> *local_78;
  long local_70;
  TPZGeoEl *local_68;
  _Rb_tree<long,_std::pair<const_long,_std::pair<long,_long>_>,_std::_Select1st<std::pair<const_long,_std::pair<long,_long>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  local_60;
  
  pTVar1 = ((this->fGMesh).fRef)->fPointer;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70 = (pTVar1->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  local_b8 = partitionindex;
  local_b0 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < local_70) {
    local_a8 = (ulong)(uint)pTVar1->fDim;
    local_78 = &(pTVar1->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>;
    iVar11 = pTVar1->fDim - 1;
    nelem = 0;
    local_a0 = (TPZGeoEl *)&PTR__TPZGeoElSide_018f8760;
    do {
      ppTVar7 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](local_78,nelem);
      pTVar2 = *ppTVar7;
      iVar5 = (**(code **)(*(long *)pTVar2 + 0x1d0))(pTVar2);
      if (iVar5 == 0) {
        iVar5 = (**(code **)(*(long *)pTVar2 + 0x210))(pTVar2);
        if (iVar5 == iVar11) {
          iVar5 = (**(code **)(*(long *)pTVar2 + 0xf0))(pTVar2);
          (**(code **)(*(long *)pTVar2 + 0x188))(&local_d0,pTVar2,iVar5 + -1);
          iVar5 = (**(code **)(*(long *)local_d0.second.first + 0x210))();
          if (iVar5 != (int)local_a8) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                       ,0x75);
          }
          lVar3 = local_b8->fStore[*(int64_t *)(local_d0.second.first + 0x30)];
          pTVar2 = (TPZGeoEl *)pTVar2->fIndex;
          local_e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)pTVar2;
          pmVar8 = std::
                   map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                   ::operator[]((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                                 *)&local_60,(key_type_conflict1 *)&local_e8);
          pmVar8->first = (long)(int)lVar3;
          pmVar8->second = (long)pTVar2;
        }
        else {
          iVar5 = (**(code **)(*(long *)pTVar2 + 0xf0))(pTVar2);
          if (0 < iVar5) {
            iVar10 = 0;
            do {
              local_e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)local_a0;
              local_e8.fGeoEl = pTVar2;
              local_e8.fSide = iVar10;
              iVar6 = TPZGeoElSide::Dimension(&local_e8);
              if (iVar6 == iVar11) {
                (**(code **)(*(long *)local_e8.fGeoEl + 0x188))
                          (local_90,local_e8.fGeoEl,local_e8.fSide);
                iVar6 = (**(code **)(*(long *)local_88 + 0x210))();
                if (iVar6 == (int)local_a8) {
                  local_68 = (TPZGeoEl *)local_b8->fStore[pTVar2->fIndex];
                  pTVar4 = (TPZGeoEl *)local_b8->fStore[local_88->fIndex];
                  if (local_68 != pTVar4) {
                    if (local_e8.fGeoEl == (TPZGeoEl *)0x0) {
                      local_d0.first = (long)local_a0;
                      local_d0.second.first = 0;
                      local_d0.second.second = CONCAT44(local_d0.second.second._4_4_,0xffffffff);
                      pTVar9 = (TPZGeoEl *)0x0;
                    }
                    else {
                      (**(code **)(*(long *)local_e8.fGeoEl + 0x188))
                                (&local_d0,local_e8.fGeoEl,local_e8.fSide);
                      pTVar9 = local_e8.fGeoEl;
                    }
                    local_80 = (int)local_d0.second.second;
                    local_88 = (TPZGeoEl *)local_d0.second.first;
                    if ((TPZGeoEl *)local_d0.second.first == pTVar9) goto LAB_01395ab0;
                    do {
                      do {
                        local_d0.second.first = (long)local_88;
                        if (local_88->fMatId == local_b0->fSkeletonMatId) goto LAB_01395b1c;
                        (**(code **)(*(long *)local_88 + 0x188))(&local_d0);
                        local_80 = (int)local_d0.second.second;
                        local_88 = (TPZGeoEl *)local_d0.second.first;
                      } while ((TPZGeoEl *)local_d0.second.first != local_e8.fGeoEl);
LAB_01395ab0:
                      local_88 = (TPZGeoEl *)local_d0.second.first;
                    } while (local_80 != local_e8.fSide);
                    TPZGeoElBC::TPZGeoElBC(&local_98,&local_e8,local_b0->fSkeletonMatId);
                    if ((TPZGeoEl *)(local_98.fCreatedElement)->fIndex == pTVar4) {
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                                 ,0xa7);
                    }
                    local_d0.second.first = (long)local_68;
                    local_d0.first = (long)(local_98.fCreatedElement)->fIndex;
                    local_d0.second.second = (long)pTVar4;
                    std::
                    _Rb_tree<long,std::pair<long_const,std::pair<long,long>>,std::_Select1st<std::pair<long_const,std::pair<long,long>>>,std::less<long>,std::allocator<std::pair<long_const,std::pair<long,long>>>>
                    ::_M_insert_unique<std::pair<long_const,std::pair<long,long>>>
                              ((_Rb_tree<long,std::pair<long_const,std::pair<long,long>>,std::_Select1st<std::pair<long_const,std::pair<long,long>>>,std::less<long>,std::allocator<std::pair<long_const,std::pair<long,long>>>>
                                *)&local_60,&local_d0);
                  }
                }
              }
LAB_01395b1c:
              iVar10 = iVar10 + 1;
            } while (iVar10 != iVar5);
          }
        }
      }
      nelem = nelem + 1;
    } while (nelem != local_70);
  }
  DefinePartition(local_b0,local_b8,
                  (map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                   *)&local_60);
  std::
  _Rb_tree<long,_std::pair<const_long,_std::pair<long,_long>_>,_std::_Select1st<std::pair<const_long,_std::pair<long,_long>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void TPZMHMeshControl::DefinePartition(TPZVec<int64_t> &partitionindex) {

    TPZGeoMesh *gmesh = this->fGMesh.operator->();

    // Creates skeleton elements
    std::map<int64_t, std::pair<int64_t, int64_t>> skeleton;

    int dim = gmesh->Dimension();

    const int64_t nel = gmesh->NElements();
    for (int64_t iel = 0; iel < nel; iel++) {

        TPZGeoEl *gel = gmesh->Element(iel);

        if (gel->HasSubElement()) continue;
        if (gel->Dimension() == dim-1)
        {
            TPZGeoElSide gelside(gel,gel->NSides()-1);
            TPZGeoElSide neighbour = gelside.Neighbour();
            if(neighbour.Element()->Dimension() != dim) DebugStop();
            int partition = partitionindex[neighbour.Element()->Index()];
            int64_t neighindex = neighbour.Element()->Index();
            auto val = std::pair<int64_t,int64_t>(partition,gel->Index());
            skeleton[gel->Index()] = val;
            continue;
        }

        // Iterates through the sides of the element
        int nsides = gel->NSides();

        for (int iside = 0; iside < nsides; iside++) {

            TPZGeoElSide gelside(gel, iside);

            // Filters boundary sides
            if (gelside.Dimension() != dim - 1) continue;

            TPZGeoElSide neighbour = gelside.Neighbour();

            // Filters neighbour sides that belong to volume elements
            if (neighbour.Element()->Dimension() != dim) continue;

            int64_t thisId = gel->Index();
            int64_t neighId = neighbour.Element()->Index();

            // This lambda checks if a skeleton has already been created over gelside
            auto hasSkeletonNeighbour = [&]() -> bool {
                neighbour = gelside.Neighbour();
                while (neighbour != gelside) {
                    int neighbourMatId = neighbour.Element()->MaterialId();
                    if (neighbourMatId == fSkeletonMatId) {
                        return true;
                    }
                   neighbour = neighbour.Neighbour();
                }
                return false;
            };

            int64_t thisGroup = partitionindex[thisId];
            int64_t neighGroup = partitionindex[neighId];

            if (thisGroup != neighGroup) {
                if (!hasSkeletonNeighbour()) {
                    TPZGeoElBC bc(gelside, fSkeletonMatId);
                    std::pair<int64_t, int64_t> adjacentGroupIndexes(thisGroup, neighGroup);
                    int64_t bc_index = bc.CreatedElement()->Index();
                    if(bc_index == neighGroup)
                    {
                        // you are unwillingly creating a boundary skeleton
                        DebugStop();
                    }
                    skeleton.insert({bc.CreatedElement()->Index(), adjacentGroupIndexes});
                }
            }
        }
    }

    DefinePartition(partitionindex, skeleton);
}